

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalArray_const<int>::SignalArray_const
          (SignalArray_const<int> *this,SignalArray<int> *siga)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  uint uVar3;
  undefined8 uStack_28;
  
  this->_vptr_SignalArray_const = (_func_int **)&PTR__SignalArray_const_001298f0;
  uStack_28 = in_RAX;
  uVar1 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[4])(siga);
  std::
  vector<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::vector(&this->const_array,(ulong)uVar1,(allocator_type *)((long)&uStack_28 + 3));
  uVar1 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[4])(siga);
  this->size = uVar1;
  uVar1 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[4])(siga);
  this->rank = uVar1;
  uVar3 = 0;
  while (uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28), uVar3 < uVar1) {
    iVar2 = (*(siga->super_SignalArray_const<int>)._vptr_SignalArray_const[3])
                      (siga,(long)&uStack_28 + 4);
    (this->const_array).
    super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uStack_28._4_4_] =
         (SignalBase<int> *)CONCAT44(extraout_var,iVar2);
    uVar1 = this->rank;
    uVar3 = uStack_28._4_4_ + 1;
  }
  return;
}

Assistant:

SignalArray_const<Time>(const SignalArray<Time> &siga)
      : const_array(siga.getSize()),
        size(siga.getSize()),
        rank(siga.getSize()) {
    for (unsigned int i = 0; i < rank; ++i) const_array[i] = &siga[i];
  }